

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXConverter::SetTextureProperties
          (FBXConverter *this,aiMaterial *out_mat,TextureMap *textures,MeshGeometry *mesh)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"DiffuseColor",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_DIFFUSE,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"AmbientColor",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_AMBIENT,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"EmissiveColor",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_EMISSIVE,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SpecularColor",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_SPECULAR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"SpecularFactor",&local_41)
  ;
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_SPECULAR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"TransparentColor",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_OPACITY,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ReflectionColor",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_REFLECTION,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"DisplacementColor",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_DISPLACEMENT,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"NormalMap",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_NORMALS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Bump",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_HEIGHT,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"ShininessExponent",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_SHININESS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"TransparencyFactor",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_OPACITY,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"EmissiveFactor",&local_41)
  ;
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_EMISSIVE,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|DiffuseTexture",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_DIFFUSE,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|NormalTexture",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_NORMALS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|SpecularTexture",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_SPECULAR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|FalloffTexture",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_OPACITY,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|ReflectionMapTexture",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_REFLECTION,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|baseColor|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_BASE_COLOR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|normalCamera|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_NORMAL_CAMERA,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|emissionColor|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_EMISSION_COLOR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|metalness|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_METALNESS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|diffuseRoughness|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_DIFFUSE_ROUGHNESS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|TEX_color_map|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_BASE_COLOR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|TEX_normal_map|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_NORMAL_CAMERA,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|TEX_emissive_map|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_EMISSION_COLOR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|TEX_metallic_map|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_METALNESS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|TEX_roughness_map|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_DIFFUSE_ROUGHNESS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Maya|TEX_ao_map|file",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_AMBIENT_OCCLUSION,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"3dsMax|Parameters|base_color_map",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_BASE_COLOR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"3dsMax|Parameters|bump_map",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_NORMAL_CAMERA,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"3dsMax|Parameters|emission_map",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_EMISSION_COLOR,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"3dsMax|Parameters|metalness_map",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_METALNESS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"3dsMax|Parameters|roughness_map",&local_41);
  TrySetTextureProperties(this,out_mat,textures,&local_40,aiTextureType_DIFFUSE_ROUGHNESS,mesh);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void FBXConverter::SetTextureProperties(aiMaterial* out_mat, const TextureMap& textures, const MeshGeometry* const mesh)
        {
            TrySetTextureProperties(out_mat, textures, "DiffuseColor", aiTextureType_DIFFUSE, mesh);
            TrySetTextureProperties(out_mat, textures, "AmbientColor", aiTextureType_AMBIENT, mesh);
            TrySetTextureProperties(out_mat, textures, "EmissiveColor", aiTextureType_EMISSIVE, mesh);
            TrySetTextureProperties(out_mat, textures, "SpecularColor", aiTextureType_SPECULAR, mesh);
            TrySetTextureProperties(out_mat, textures, "SpecularFactor", aiTextureType_SPECULAR, mesh);
            TrySetTextureProperties(out_mat, textures, "TransparentColor", aiTextureType_OPACITY, mesh);
            TrySetTextureProperties(out_mat, textures, "ReflectionColor", aiTextureType_REFLECTION, mesh);
            TrySetTextureProperties(out_mat, textures, "DisplacementColor", aiTextureType_DISPLACEMENT, mesh);
            TrySetTextureProperties(out_mat, textures, "NormalMap", aiTextureType_NORMALS, mesh);
            TrySetTextureProperties(out_mat, textures, "Bump", aiTextureType_HEIGHT, mesh);
            TrySetTextureProperties(out_mat, textures, "ShininessExponent", aiTextureType_SHININESS, mesh);
			TrySetTextureProperties( out_mat, textures, "TransparencyFactor", aiTextureType_OPACITY, mesh );
			TrySetTextureProperties( out_mat, textures, "EmissiveFactor", aiTextureType_EMISSIVE, mesh );
            //Maya counterparts
            TrySetTextureProperties(out_mat, textures, "Maya|DiffuseTexture", aiTextureType_DIFFUSE, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|NormalTexture", aiTextureType_NORMALS, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|SpecularTexture", aiTextureType_SPECULAR, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|FalloffTexture", aiTextureType_OPACITY, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|ReflectionMapTexture", aiTextureType_REFLECTION, mesh);
            
            // Maya PBR
            TrySetTextureProperties(out_mat, textures, "Maya|baseColor|file", aiTextureType_BASE_COLOR, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|normalCamera|file", aiTextureType_NORMAL_CAMERA, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|emissionColor|file", aiTextureType_EMISSION_COLOR, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|metalness|file", aiTextureType_METALNESS, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|diffuseRoughness|file", aiTextureType_DIFFUSE_ROUGHNESS, mesh);
            
            // Maya stingray
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_color_map|file", aiTextureType_BASE_COLOR, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_normal_map|file", aiTextureType_NORMAL_CAMERA, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_emissive_map|file", aiTextureType_EMISSION_COLOR, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_metallic_map|file", aiTextureType_METALNESS, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_roughness_map|file", aiTextureType_DIFFUSE_ROUGHNESS, mesh);
            TrySetTextureProperties(out_mat, textures, "Maya|TEX_ao_map|file", aiTextureType_AMBIENT_OCCLUSION, mesh);

            // 3DSMax PBR
            TrySetTextureProperties(out_mat, textures, "3dsMax|Parameters|base_color_map", aiTextureType_BASE_COLOR, mesh);
            TrySetTextureProperties(out_mat, textures, "3dsMax|Parameters|bump_map", aiTextureType_NORMAL_CAMERA, mesh);
            TrySetTextureProperties(out_mat, textures, "3dsMax|Parameters|emission_map", aiTextureType_EMISSION_COLOR, mesh);
            TrySetTextureProperties(out_mat, textures, "3dsMax|Parameters|metalness_map", aiTextureType_METALNESS, mesh);
            TrySetTextureProperties(out_mat, textures, "3dsMax|Parameters|roughness_map", aiTextureType_DIFFUSE_ROUGHNESS, mesh);
        }